

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool anon_unknown.dwarf_b0093a::HasNonLayoutQualifiers(TType *type,TQualifier *qualifier)

{
  bool bVar1;
  int iVar2;
  bool local_1a;
  bool local_19;
  TQualifier *qualifier_local;
  TType *type_local;
  
  local_19 = true;
  if ((*(ulong *)&qualifier->field_0x8 >> 0x1c & 1) == 0) {
    bVar1 = glslang::TQualifier::hasLocation(qualifier);
    local_1a = false;
    if (bVar1) {
      iVar2 = (*type->_vptr_TType[7])();
      local_1a = iVar2 == 0x10;
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

bool HasNonLayoutQualifiers(const glslang::TType& type, const glslang::TQualifier& qualifier)
{
    // This should list qualifiers that simultaneous satisfy:
    // - struct members might inherit from a struct declaration
    //     (note that non-block structs don't explicitly inherit,
    //      only implicitly, meaning no decoration involved)
    // - affect decorations on the struct members
    //     (note smooth does not, and expecting something like volatile
    //      to effect the whole object)
    // - are not part of the offset/st430/etc or row/column-major layout
    return qualifier.invariant || (qualifier.hasLocation() && type.getBasicType() == glslang::EbtBlock);
}